

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

int cmdParse(char *buf,uintptr_t *p,uint ext_len,char *ext,cmdCtlParse_t *ctl)

{
  int iVar1;
  size_t sVar2;
  undefined4 *in_RCX;
  uint in_EDX;
  long *in_RSI;
  long in_RDI;
  int *in_R8;
  int eaten;
  int8_t to5;
  int8_t to4;
  int8_t to3;
  int8_t to2;
  int8_t to1;
  uintptr_t tp5;
  uintptr_t tp4;
  uintptr_t tp3;
  uintptr_t tp2;
  uintptr_t tp1;
  char c;
  int32_t *p32;
  char *p8;
  int n2;
  int n;
  int pars;
  int pp;
  int val;
  int idx;
  int valid;
  int f;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6c;
  char in_stack_ffffffffffffff6d;
  undefined1 uVar3;
  char in_stack_ffffffffffffff6e;
  undefined1 uVar4;
  char in_stack_ffffffffffffff6f;
  char cVar5;
  uintptr_t *val_00;
  char *pcVar6;
  char local_61;
  undefined4 *local_60;
  undefined4 *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int *local_30;
  undefined4 *local_28;
  long *local_18;
  long local_10;
  int local_4;
  
  pcVar6 = (char *)0x0;
  val_00 = (uintptr_t *)0x0;
  if (in_EDX < 0x800) {
    local_4 = -3;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(in_R8 + 1,0,4);
    __isoc99_sscanf(local_10 + *local_30," %31s %n",intCmdStr,&local_44);
    *local_30 = local_44 + *local_30;
    *local_18 = -1;
    local_3c = cmdMatch(in_stack_ffffffffffffff58);
    intCmdIdx = local_3c;
    local_4 = local_3c;
    if (-1 < local_3c) {
      local_38 = 0;
      *local_18 = (long)cmdInfo[local_3c].cmd;
      local_18[1] = 0;
      local_18[2] = 0;
      local_18[3] = 0;
      switch(cmdInfo[local_3c].vt) {
      case 0x65:
        local_38 = 1;
        break;
      case 0x6f:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ('\0' < *(char *)((long)local_30 + 5)) {
          local_38 = 1;
        }
        break;
      case 0x70:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if (('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) {
          local_38 = 1;
        }
        break;
      case 0x71:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if (('\0' < *(char *)((long)local_30 + 5)) && ((ulong)local_18[1] < 0x96)) {
          local_38 = 1;
        }
        break;
      case 0x72:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if (*(char *)((long)local_30 + 5) == '\x01') {
          local_38 = 1;
        }
        break;
      case 0x73:
        sVar2 = strlen((char *)(local_10 + *local_30));
        local_18[3] = sVar2;
        memcpy(local_28,(void *)(local_10 + *local_30),local_18[3]);
        *local_30 = *local_30 + (int)local_18[3];
        local_38 = 1;
        break;
      case 0x74:
        local_34 = __isoc99_sscanf(local_10 + *local_30," %*s%n %n",&local_4c,&local_50);
        if ((-1 < local_34) && (local_4c != 0)) {
          local_18[3] = (long)local_4c;
          *(undefined1 *)((long)local_30 + 7) = 1;
          memcpy(local_28,(void *)(local_10 + *local_30),(long)local_4c);
          *local_30 = local_50 + *local_30;
          local_38 = 1;
        }
        break;
      case 0x79:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ((('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) &&
           (('\0' < *(char *)((long)local_30 + 6) && (-1 < (int)local_18[2])))) {
          local_38 = 1;
        }
        break;
      case 0x7a:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ((('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) &&
           ('\0' < *(char *)((long)local_30 + 6))) {
          local_38 = 1;
        }
        break;
      case 0x7b:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ((('\0' < *(char *)((long)local_30 + 5)) && ((ulong)local_18[1] < 0x96)) &&
           ('\0' < *(char *)((long)local_30 + 6))) {
          local_38 = 1;
        }
        break;
      case 0x7c:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ((('\0' < *(char *)((long)local_30 + 5)) && ((ulong)local_18[1] < 0x96)) &&
           (('\0' < *(char *)((long)local_30 + 6) && ((ulong)local_18[2] < 0x96)))) {
          local_38 = 1;
        }
        break;
      case 0x7d:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        local_34 = __isoc99_sscanf(local_10 + *local_30," %c %n",&local_61,&local_4c);
        if ((('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) && (0 < local_34)) {
          *local_30 = local_4c + *local_30;
          local_40 = toupper((int)local_61);
          pcVar6 = strchr(fmtMdeStr,local_40);
          if (pcVar6 != (char *)0x0) {
            local_18[2] = (long)((int)pcVar6 - (int)fmtMdeStr);
            local_38 = 1;
          }
        }
        break;
      case 0x7e:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        local_34 = __isoc99_sscanf(local_10 + *local_30," %c %n",&local_61,&local_4c);
        if ((('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) && (0 < local_34)) {
          *local_30 = local_4c + *local_30;
          local_40 = toupper((int)local_61);
          pcVar6 = strchr(fmtPudStr,local_40);
          if (pcVar6 != (char *)0x0) {
            local_18[2] = (long)((int)pcVar6 - (int)fmtPudStr);
            local_38 = 1;
          }
        }
        break;
      case 0x7f:
        local_34 = __isoc99_sscanf(local_10 + *local_30," %*s%n %n",&local_4c,&local_50);
        if ((-1 < local_34) && (local_4c != 0)) {
          local_18[3] = (long)local_4c;
          *(undefined1 *)((long)local_30 + 6) = 1;
          memcpy(local_28,(void *)(local_10 + *local_30),(long)local_4c);
          *local_30 = local_50 + *local_30;
          iVar1 = getNum(pcVar6,val_00,
                         (int8_t *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT15(in_stack_ffffffffffffff6d,
                                                    CONCAT14(in_stack_ffffffffffffff6c,
                                                             in_stack_ffffffffffffff68)))));
          *local_30 = iVar1 + *local_30;
          if (('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) {
            local_38 = 1;
          }
        }
        break;
      case 0x80:
        local_34 = __isoc99_sscanf(local_10 + *local_30," %*s%n %n",&local_4c,&local_50);
        if ((-1 < local_34) && (local_4c != 0)) {
          local_38 = 1;
          local_18[1] = (long)local_4c;
          memcpy(local_28,(void *)(local_10 + *local_30),(long)local_4c);
          *local_30 = local_4c + *local_30;
          *(undefined1 *)((long)local_28 + (long)local_4c) = 0;
          sVar2 = strlen((char *)(local_10 + *local_30 + 1));
          local_50 = (int)sVar2;
          memcpy((undefined1 *)((long)local_28 + (long)local_4c + 1),
                 (void *)(local_10 + *local_30 + 1),(long)local_50);
          *local_30 = local_50 + *local_30;
          *local_30 = *local_30 + 1;
          local_18[3] = local_18[1] + (long)local_50 + 1;
        }
        break;
      case 0x83:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if (((('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) &&
            ('\0' < *(char *)((long)local_30 + 6))) &&
           ((-1 < (int)local_18[2] && ('\0' < *(char *)((long)local_30 + 7))))) {
          local_18[3] = 4;
          *local_28 = 0;
          local_38 = 1;
        }
        break;
      case 0x84:
        local_34 = __isoc99_sscanf(local_10 + *local_30," %*s%n %n",&local_4c,&local_50);
        if ((-1 < local_34) && (local_4c != 0)) {
          local_18[3] = (long)local_4c;
          *(undefined1 *)((long)local_30 + 6) = 1;
          memcpy(local_28,(void *)(local_10 + *local_30),(long)local_4c);
          *local_30 = local_50 + *local_30;
          iVar1 = getNum(pcVar6,val_00,
                         (int8_t *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT15(in_stack_ffffffffffffff6d,
                                                    CONCAT14(in_stack_ffffffffffffff6c,
                                                             in_stack_ffffffffffffff68)))));
          *local_30 = iVar1 + *local_30;
          iVar1 = getNum(pcVar6,val_00,
                         (int8_t *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT15(in_stack_ffffffffffffff6d,
                                                    CONCAT14(in_stack_ffffffffffffff6c,
                                                             in_stack_ffffffffffffff68)))));
          *local_30 = iVar1 + *local_30;
          if ((('\0' < *(char *)((long)local_30 + 5)) &&
              ((-1 < (int)local_18[1] && ('\0' < *(char *)((long)local_30 + 6))))) &&
             (-1 < (int)local_18[2])) {
            local_38 = 1;
          }
        }
        break;
      case 0x85:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if (((('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) &&
            ('\0' < *(char *)((long)local_30 + 6))) && (in_stack_ffffffffffffff6f == '\x01')) {
          local_18[3] = 4;
          *local_28 = 0;
          local_38 = 1;
        }
        break;
      case 0x86:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if (((('\0' < *(char *)((long)local_30 + 5)) && (-1 < (int)local_18[1])) &&
            (in_stack_ffffffffffffff6f == '\x01')) &&
           (((in_stack_ffffffffffffff6e == '\x01' && (in_stack_ffffffffffffff6d == '\x01')) &&
            ((in_stack_ffffffffffffff6c == '\x01' &&
             ((-1 < (int)pcVar6 && ((char)((uint)in_stack_ffffffffffffff68 >> 0x18) == '\x01')))))))
           ) {
          local_18[3] = 0x14;
          *local_28 = 0;
          local_28[1] = 0;
          local_28[2] = 0;
          local_28[3] = (int)pcVar6;
          local_28[4] = (int)val_00;
          local_38 = 1;
        }
        break;
      case 0xbf:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ((*(char *)((long)local_30 + 5) == '\x01') && (-1 < (int)local_18[1])) {
          local_48 = 0;
          local_60 = local_28;
          while (local_48 < 10) {
            iVar1 = getNum(pcVar6,val_00,
                           (int8_t *)
                           CONCAT17(in_stack_ffffffffffffff6f,
                                    CONCAT16(in_stack_ffffffffffffff6e,
                                             CONCAT15(in_stack_ffffffffffffff6d,
                                                      CONCAT14(in_stack_ffffffffffffff6c,
                                                               in_stack_ffffffffffffff68)))));
            *local_30 = iVar1 + *local_30;
            if (in_stack_ffffffffffffff6f != '\x01') break;
            local_48 = local_48 + 1;
            *local_60 = 0;
            in_stack_ffffffffffffff6f = '\x01';
            local_60 = local_60 + 1;
          }
          local_18[3] = (long)(local_48 << 2);
          local_38 = 1;
        }
        break;
      case 0xc0:
        local_48 = 0;
        local_60 = local_28;
        while (local_48 < 0x200) {
          iVar1 = getNum(pcVar6,val_00,
                         (int8_t *)
                         CONCAT17(in_stack_ffffffffffffff6f,
                                  CONCAT16(in_stack_ffffffffffffff6e,
                                           CONCAT15(in_stack_ffffffffffffff6d,
                                                    CONCAT14(in_stack_ffffffffffffff6c,
                                                             in_stack_ffffffffffffff68)))));
          *local_30 = iVar1 + *local_30;
          if (in_stack_ffffffffffffff6f != '\x01') break;
          local_48 = local_48 + 1;
          *local_60 = 0;
          in_stack_ffffffffffffff6f = '\x01';
          local_60 = local_60 + 1;
        }
        local_18[3] = (long)(local_48 << 2);
        if ((local_48 != 0) && (local_48 % 3 == 0)) {
          local_38 = 1;
        }
        break;
      case 0xc1:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ((*(char *)((long)local_30 + 5) == '\x01') && (-1 < (int)local_18[1])) {
          local_48 = 0;
          local_58 = local_28;
          while ((local_48 < 0x200 &&
                 (iVar1 = getNum(pcVar6,val_00,
                                 (int8_t *)
                                 CONCAT17(in_stack_ffffffffffffff6f,
                                          CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT15(in_stack_ffffffffffffff6d,
                                                            CONCAT14(in_stack_ffffffffffffff6c,
                                                                     in_stack_ffffffffffffff68))))),
                 in_stack_ffffffffffffff6f == '\x01'))) {
            local_48 = local_48 + 1;
            *(undefined1 *)local_58 = 0;
            *local_30 = iVar1 + *local_30;
            in_stack_ffffffffffffff6f = '\x01';
            local_58 = (undefined4 *)((long)local_58 + 1);
          }
          local_18[3] = (long)local_48;
          if ((local_48 != 0) || (*local_18 == 0x72)) {
            local_38 = 1;
          }
        }
        break;
      case 0xc2:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ((((*(char *)((long)local_30 + 5) == '\x01') && (*(char *)((long)local_30 + 6) == '\x01')
             ) && (-1 < (int)local_18[1])) &&
           ((-1 < (int)local_18[2] && ((int)local_18[2] < 0x100)))) {
          local_48 = 0;
          local_58 = local_28;
          while ((local_48 < 0x20 &&
                 (iVar1 = getNum(pcVar6,val_00,
                                 (int8_t *)
                                 CONCAT17(in_stack_ffffffffffffff6f,
                                          CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT15(in_stack_ffffffffffffff6d,
                                                            CONCAT14(in_stack_ffffffffffffff6c,
                                                                     in_stack_ffffffffffffff68))))),
                 in_stack_ffffffffffffff6f == '\x01'))) {
            local_48 = local_48 + 1;
            *(undefined1 *)local_58 = 0;
            *local_30 = iVar1 + *local_30;
            in_stack_ffffffffffffff6f = '\x01';
            local_58 = (undefined4 *)((long)local_58 + 1);
          }
          local_18[3] = (long)local_48;
          if (0 < local_48) {
            local_38 = 1;
          }
        }
        break;
      case 0xc3:
        local_38 = 1;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if (*(char *)((long)local_30 + 5) == '\x01') {
          if ((int)local_18[1] < 0) {
            local_38 = 0;
          }
          else {
            iVar1 = getNum(pcVar6,val_00,
                           (int8_t *)
                           CONCAT17(in_stack_ffffffffffffff6f,
                                    CONCAT16(in_stack_ffffffffffffff6e,
                                             CONCAT15(in_stack_ffffffffffffff6d,
                                                      CONCAT14(in_stack_ffffffffffffff6c,
                                                               in_stack_ffffffffffffff68)))));
            *local_30 = iVar1 + *local_30;
            if (*(char *)((long)local_30 + 6) == '\x01') {
              if ((int)local_18[2] < 0) {
                local_38 = 0;
              }
              else {
                local_48 = 0;
                local_58 = local_28;
                while ((local_48 < 0x200 &&
                       (iVar1 = getNum(pcVar6,val_00,
                                       (int8_t *)
                                       CONCAT17(in_stack_ffffffffffffff6f,
                                                CONCAT16(in_stack_ffffffffffffff6e,
                                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                                  CONCAT14(in_stack_ffffffffffffff6c
                                                                           ,
                                                  in_stack_ffffffffffffff68))))),
                       in_stack_ffffffffffffff6f == '\x01'))) {
                  local_48 = local_48 + 1;
                  *(undefined1 *)local_58 = 0;
                  *local_30 = iVar1 + *local_30;
                  in_stack_ffffffffffffff6f = '\x01';
                  local_58 = (undefined4 *)((long)local_58 + 1);
                }
                local_18[3] = (long)local_48;
              }
            }
          }
        }
        break;
      case 0xc4:
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        iVar1 = getNum(pcVar6,val_00,
                       (int8_t *)
                       CONCAT17(in_stack_ffffffffffffff6f,
                                CONCAT16(in_stack_ffffffffffffff6e,
                                         CONCAT15(in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           in_stack_ffffffffffffff68)))));
        *local_30 = iVar1 + *local_30;
        if ((((((*(char *)((long)local_30 + 5) == '\x01') && (-1 < (int)local_18[1])) &&
              (*(char *)((long)local_30 + 6) == '\x01')) &&
             ((0 < (int)local_18[2] && (in_stack_ffffffffffffff6f == '\x01')))) &&
            (in_stack_ffffffffffffff6e == '\x01')) && (in_stack_ffffffffffffff6d == '\x01')) {
          local_48 = 0;
          *local_28 = 0;
          local_28[1] = 0;
          local_28[2] = 0;
          uVar4 = 1;
          uVar3 = 1;
          local_58 = local_28 + 3;
          while ((cVar5 = '\x01', local_48 < 0x200 &&
                 (iVar1 = getNum(pcVar6,val_00,
                                 (int8_t *)
                                 CONCAT17(1,CONCAT16(uVar4,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  in_stack_ffffffffffffff68))))), cVar5 == '\x01')))
          {
            *(undefined1 *)local_58 = 0;
            local_48 = local_48 + 1;
            *local_30 = iVar1 + *local_30;
            local_58 = (undefined4 *)((long)local_58 + 1);
          }
          local_18[3] = (long)(local_48 + 0xc);
          if (0 < local_48) {
            local_38 = 1;
          }
        }
        break;
      case 0xc5:
        local_48 = 0;
        local_58 = local_28;
        while ((local_48 < 0x200 &&
               (iVar1 = getNum(pcVar6,val_00,
                               (int8_t *)
                               CONCAT17(in_stack_ffffffffffffff6f,
                                        CONCAT16(in_stack_ffffffffffffff6e,
                                                 CONCAT15(in_stack_ffffffffffffff6d,
                                                          CONCAT14(in_stack_ffffffffffffff6c,
                                                                   in_stack_ffffffffffffff68))))),
               in_stack_ffffffffffffff6f == '\x01'))) {
          local_48 = local_48 + 1;
          *(undefined1 *)local_58 = 0;
          *local_30 = iVar1 + *local_30;
          in_stack_ffffffffffffff6f = '\x01';
          local_58 = (undefined4 *)((long)local_58 + 1);
        }
        local_18[3] = (long)local_48;
        if (local_48 != 0) {
          local_38 = 1;
        }
      }
      if (local_38 == 0) {
        local_4 = -2;
      }
      else {
        local_4 = local_3c;
      }
    }
  }
  return local_4;
}

Assistant:

int cmdParse(
   char *buf, uintptr_t *p, unsigned ext_len, char *ext, cmdCtlParse_t *ctl)
{
   int f, valid, idx, val, pp, pars, n, n2;
   char *p8;
   int32_t *p32;
   char c;
   uintptr_t tp1=0, tp2=0, tp3=0, tp4=0, tp5=0;
   int8_t to1, to2, to3, to4, to5;
   int eaten;

   /* Check that ext is big enough for the largest message. */
   if (ext_len < (4 * CMD_MAX_PARAM)) return CMD_EXT_TOO_SMALL;

   bzero(&ctl->opt, sizeof(ctl->opt));

   sscanf(buf+ctl->eaten, " %31s %n", intCmdStr, &pp);

   ctl->eaten += pp;

   p[0] = -1;

   idx = cmdMatch(intCmdStr);

   intCmdIdx = idx;

   if (idx < 0) return idx;

   valid = 0;

   p[0] = cmdInfo[idx].cmd;
   p[1] = 0;
   p[2] = 0;
   p[3] = 0;

   switch (cmdInfo[idx].vt)
   {
      case 101: /* BR1  BR2  CGI  H  HELP  HWVER
                   DCRA  HALT  INRA  NO
                   PIGPV  POPA  PUSHA  RET  T  TICK  WVBSY  WVCLR
                   WVCRE  WVGO  WVGOR  WVHLT  WVNEW

                   No parameters, always valid.
                */
         valid = 1;

         break;

      case 111: /* ADD  AND  BC1  BC2  BS1  BS2  
                   CMP  CSI  DIV  LDA  LDAB  MLT
                   MOD  OR  RLA  RRA  STAB  SUB  WAIT  XOR

                   One parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] > 0) valid = 1;

         break;

      case 112: /* BI2CC FC  GDC  GPW  I2CC  I2CRB
                   MG  MICS  MILS  MODEG  NC  NP  PADG PFG  PRG
                   PROCD  PROCP  PROCS  PRRG  R  READ  SLRC  SPIC
                   WVDEL  WVSC  WVSM  WVSP  WVTX  WVTXR  BSPIC

                   One positive parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)) valid = 1;

         break;

      case 113: /* DCR  INR  POP  PUSH  STA  XA

                   One register parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 114: /* CALL  JM  JMP  JNZ  JP  JZ  TAG

                   One numeric parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         if (ctl->opt[1] == CMD_NUMERIC) valid = 1;

         break;

      case 115: /* PARSE  PROC

                   One parameter, string (rest of input).
                */
         p[3] = strlen(buf+ctl->eaten);
         memcpy(ext, buf+ctl->eaten, p[3]);
         ctl->eaten += p[3];
         valid = 1;

         break;

      case 116: /* SYS

                   One parameter, a string.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[3] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;
            valid = 1;
         }

         break;

      case 121: /* HC  FR  I2CRD  I2CRR  I2CRW  I2CWB I2CWQ  P
                   PADS  PFS  PRS  PWM  S  SERVO  SLR  SLRI  W
                   WDOG  WRITE  WVTXM

                   Two positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0)) valid = 1;

         break;

      case 122: /* NB

                   Two parameters, first positive, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 123: /* LD  RL  RR

                   Two parameters, first register, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) &&
             (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 124: /* X

                   Two register parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0) && (p[2] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 125: /* M MODES

                   Two parameters, first positive, second in 'RW540123'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtMdeStr, val);

            if (p8 != NULL)
            {
               val = p8 - fmtMdeStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 126: /* PUD

                   Two parameters, first positive, second in 'ODU'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)  && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtPudStr, val);
            if (p8 != NULL)
            {
               val = p8 - fmtPudStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 127: /* FL  FO

                   Two parameters, first a string, other positive.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0))
               valid = 1;
         }

         break;

      case 128: /* SHELL

                   Two string parameters, the first space teminated.
                   The second arbitrary.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);

         if ((f >= 0) && n)
         {
            valid = 1;

            p[1] = n;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n;
            ext[n] = 0; /* terminate first string */

            n2 = strlen(buf+ctl->eaten+1);
            memcpy(ext+n+1, buf+ctl->eaten+1, n2);
            ctl->eaten += n2;
            ctl->eaten ++;
            p[3] = p[1] + n2 + 1;
         }

         break;

      case 131: /* BI2CO  HP  I2CO  I2CPC  I2CRI  I2CWB  I2CWW
                   SLRO  SPIO  TRIG

                   Three positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &ctl->opt[3]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0) &&
             (ctl->opt[3] > 0) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 132: /* SERO

                   Three parameters, first a string, rest >=0
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
            ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
                (ctl->opt[2] > 0) && ((int)p[2] >= 0))
               valid = 1;
         }

         break;

      case 133: /* FS

                   Three parameters.  First and third positive.
                   Second may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 134: /* BSPIO

                   Six parameters.  First to Fifth positive.
                   Sixth may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);
         ctl->eaten += getNum(buf+ctl->eaten, &tp4, &to4);
         ctl->eaten += getNum(buf+ctl->eaten, &tp5, &to5);
                                    
         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0) &&
             (to2 == CMD_NUMERIC) && ((int)tp2 >= 0) &&
             (to3 == CMD_NUMERIC) && ((int)tp3 >= 0) &&
             (to4 == CMD_NUMERIC) && ((int)tp4 >= 0) &&
             (to5 == CMD_NUMERIC))
         {
            p[3] = 5 * 4;
            memcpy(ext+ 0, &tp1, 4);
            memcpy(ext+ 4, &tp2, 4);
            memcpy(ext+ 8, &tp3, 4);
            memcpy(ext+12, &tp4, 4);
            memcpy(ext+16, &tp5, 4);
            valid = 1;
         }

         break;

      case 191: /* PROCR PROCU

                   One to 11 parameters, first positive,
                   optional remainder, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p32 = (int32_t *)ext;

            while (pars < PI_MAX_SCRIPT_PARAMS)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  pars++;
                  *p32++ = tp1;
               }
               else break;
            }

            p[3] = pars * 4;

            valid = 1;
         }

         break;

      case 192: /* WVAG

                   One or more triplets (gpios on, gpios off, delay),
                   any value.
                */

         pars = 0;
         p32 = (int32_t *)ext;

         while (pars < CMD_MAX_PARAM)
         {
            ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               pars++;
               *p32++ = tp1;
            }
            else break;
         }

         p[3] = pars * 4;

         if (pars && ((pars % 3) == 0)) valid = 1;

         break;

      case 193: /* BI2CZ  BSCX  BSPIX  FW  I2CWD  I2CZ  SERW
		   SPIW  SPIX

                   Two or more parameters, first >=0, rest 0-255.

		   BSCX is special case one or more.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p8 = ext;

            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars || (p[0]==PI_CMD_BSCX)) valid = 1;
         }

         break;

      case 194: /* I2CPK  I2CWI  I2CWK

                   Three to 34 parameters, all 0-255.
                */

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] == CMD_NUMERIC) &&
             (ctl->opt[2] == CMD_NUMERIC) &&
             ((int)p[1]>=0) && ((int)p[2]>=0) && ((int)p[2]<=255))
         {
            pars = 0;
            p8 = ext;

            while (pars < 32)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars > 0) valid = 1;
         }

         break;

      case 195: /* CF1  CF2

                   Zero or more parameters, first two >=0, rest 0-255.
                */
         valid = 1;

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] == CMD_NUMERIC)
         {
            if ((int)p[1] >= 0)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

               if (ctl->opt[2] == CMD_NUMERIC)
               {
                  if ((int)p[2] >= 0)
                  {
                     pars = 0;
                     p8 = ext;

                     while (pars < CMD_MAX_PARAM)
                     {
                        eaten = getNum(buf+ctl->eaten, &tp1, &to1);
                        if (to1 == CMD_NUMERIC)
                        {
                           if (((int)tp1>=0) && ((int)tp1<=255))
                           {
                              pars++;
                              *p8++ = tp1;
                              ctl->eaten += eaten;
                           }
                           else break;
                        }
                        else break;
                     }

                     p[3] = pars;
                  }
                  else valid = 0;
               }
            }
            else valid = 0;
         }

         break;

      case 196: /* WVAS

                   gpio baud offset char...

                   p1 gpio
                   p2 baud
                   p3 len + 4
                   ---------
                   uint32_t databits
                   uint32_t stophalfbits
                   uint32_t offset
                   uint8_t[len]
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0) &&
             (ctl->opt[2] == CMD_NUMERIC) && ((int)p[2] > 0) &&
             (to1 == CMD_NUMERIC) &&
             (to2 == CMD_NUMERIC) &&
             (to3 == CMD_NUMERIC))
         {
            pars = 0;

            memcpy(ext, &tp1, 4);
            memcpy(ext+4, &tp2, 4);
            memcpy(ext+8, &tp3, 4);
            p8 = ext + 12;
            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     *p8++ = tp1;
                     pars++;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars + 12;

            if (pars > 0) valid = 1;
         }

         break;

      case 197: /* WVCHA

                   One or more parameters, all 0-255.
                */
         pars = 0;
         p8 = ext;

         while (pars < CMD_MAX_PARAM)
         {
            eaten = getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               if (((int)tp1>=0) && ((int)tp1<=255))
               {
                  pars++;
                  *p8++ = tp1;
                  ctl->eaten += eaten;
               }
               else break; /* invalid number, end of command */
            }
            else break;
         }

         p[3] = pars;

         if (pars) valid = 1;

         break;


   }

   if (valid) return idx; else return CMD_BAD_PARAMETER;
}